

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildCallCommon
          (IRBuilder *this,Instr *instr,StackSym *symDst,ArgSlot argCount,CallFlags flags)

{
  OpCode OVar1;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  OpndKind OVar8;
  ArgSlot AVar9;
  uint uVar10;
  uint32 uVar11;
  uint byteCodeOffset;
  undefined4 *puVar12;
  Type *ppIVar13;
  Opnd *pOVar14;
  Type pIVar15;
  Type pIVar16;
  Type pIVar17;
  uint uVar18;
  
  OVar1 = instr->m_opcode;
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1a7b,"(!m_argStack->Empty())","!m_argStack->Empty()");
    if (!bVar5) goto LAB_004dc1cd;
    *puVar12 = 0;
  }
  pSVar2 = this->m_argStack;
  ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                       (&pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  pIVar17 = *ppIVar13;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
             pSVar2->allocator);
  bVar5 = pIVar17 == (Type)0x0;
  if (bVar5) {
    uVar18 = 0;
    pIVar16 = instr;
  }
  else {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar15 = instr;
    if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
        (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      pIVar16 = pIVar17;
      do {
        pIVar17 = pIVar16;
        if (pIVar16->m_opcode == StartCall) break;
        pOVar14 = pIVar16->m_dst;
        if (pIVar15->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar5) goto LAB_004dc1cd;
          *puVar12 = 0;
        }
        pFVar3 = pIVar15->m_func;
        if (pOVar14->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar5) goto LAB_004dc1cd;
          *puVar12 = 0;
        }
        bVar6 = pOVar14->field_0xb;
        if ((bVar6 & 2) != 0) {
          pOVar14 = IR::Opnd::Copy(pOVar14,pFVar3);
          bVar6 = pOVar14->field_0xb;
        }
        pOVar14->field_0xb = bVar6 | 2;
        pIVar15->m_src2 = pOVar14;
        uVar18 = uVar18 + 1;
        pSVar2 = this->m_argStack;
        ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&pSVar2->
                               super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
        pIVar17 = *ppIVar13;
        SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  (&pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
                   pSVar2->allocator);
        bVar5 = pIVar17 == (Type)0x0;
        if (bVar5) goto LAB_004dbe5f;
        pIVar15 = pIVar16;
        pIVar16 = pIVar17;
      } while ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
               (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next != this->m_argStack);
    }
    pIVar16 = pIVar15;
    if ((!bVar5) && (pIVar17->m_opcode != StartCall)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1a86,
                         "(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall)",
                         "argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall");
      if (!bVar7) goto LAB_004dc1cd;
      *puVar12 = 0;
    }
  }
LAB_004dbe5f:
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    this->callTreeHasSomeProfileInfo = false;
  }
  uVar10 = OVar1 - 0xc4;
  if (((uVar10 < 6) && ((0x29U >> (uVar10 & 0x1f) & 1) != 0)) || (OVar1 == 0x160)) {
    uVar18 = uVar18 + 1;
    this->m_argsOnStack = this->m_argsOnStack + 1;
  }
  AVar9 = Js::CallInfo::GetArgCountWithExtraArgs(flags,(uint)argCount);
  uVar10 = (uint)AVar9;
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aa3,"(false)","Expect StartCall on other opcodes...");
joined_r0x004dc0ef:
    if (!bVar5) goto LAB_004dc1cd;
    *puVar12 = 0;
  }
  else {
    pOVar14 = pIVar17->m_dst;
    if (pIVar16->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_004dc1cd;
      *puVar12 = 0;
    }
    pFVar3 = pIVar16->m_func;
    if (pOVar14->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_004dc1cd;
      *puVar12 = 0;
    }
    bVar6 = pOVar14->field_0xb;
    if ((bVar6 & 2) != 0) {
      pOVar14 = IR::Opnd::Copy(pOVar14,pFVar3);
      bVar6 = pOVar14->field_0xb;
    }
    pOVar14->field_0xb = bVar6 | 2;
    pIVar16->m_src2 = pOVar14;
    if (instr->m_prev->m_opcode != LdSpreadIndices) {
      OVar8 = IR::Opnd::GetKind(pIVar17->m_src1);
      if (OVar8 == OpndKindIntConst) {
        pOVar14 = pIVar17->m_src1;
        OVar8 = IR::Opnd::GetKind(pOVar14);
        if (OVar8 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar5) goto LAB_004dc1cd;
          *puVar12 = 0;
        }
        if ((uVar18 == uVar10) && (pOVar14[1]._vptr_Opnd == (_func_int **)(long)(int)uVar18))
        goto LAB_004dc0fc;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1a9f,
                         "(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices || (argInstr->GetSrc1()->IsIntConstOpnd() && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count && count == argCount))"
                         ,"StartCall has wrong number of arguments...");
      goto joined_r0x004dc0ef;
    }
  }
LAB_004dc0fc:
  uVar11 = this->m_callsOnStack - 1;
  this->m_callsOnStack = uVar11;
  uVar18 = this->m_argsOnStack;
  if (this->m_func->m_argSlotsForFunctionsCalled < uVar18) {
    this->m_func->m_argSlotsForFunctionsCalled = uVar18;
  }
  if (uVar18 != uVar10 && uVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aaf,"(m_argsOnStack == argCount)","m_argsOnStack == argCount");
    if (!bVar5) {
LAB_004dc1cd:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar12 = 0;
  }
  this->m_argsOnStack = this->m_argsOnStack - uVar10;
  bVar5 = Func::IsJitInDebugMode(this->m_func);
  if (bVar5) {
    byteCodeOffset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    InsertBailOutForDebugger
              (this,byteCodeOffset,
               BailOutIgnoreException|BailOutStep|BailOutLocalValueChanged|BailOutStackFrameBase|
               BailOutBreakPointInFunction|BailOutForceByFlag,(Instr *)0x0);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::BuildCallCommon(IR::Instr * instr, StackSym * symDst, Js::ArgSlot argCount, Js::CallFlags flags)
{
    Js::OpCode newOpcode = instr->m_opcode;

    IR::Instr *     argInstr = nullptr;
    IR::Instr *     prevInstr = instr;
#if DBG
    int count = 0;
#endif

    // Link all the args of this call by creating a def/use chain through the src2.
    AssertOrFailFast(!m_argStack->Empty());
    for (argInstr = m_argStack->Pop();
        argInstr && !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall;
        argInstr = m_argStack->Pop())
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
#if DBG
        count++;
#endif
    }
    AssertOrFailFast(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall);

    if (m_argStack->Empty())
    {
        this->callTreeHasSomeProfileInfo = false;
    }

    if (newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray
        || newOpcode == Js::OpCode::NewScObjectSpread || newOpcode == Js::OpCode::NewScObjArraySpread)
    {
#if DBG
        count++;
#endif
        m_argsOnStack++;
    }

    argCount = Js::CallInfo::GetArgCountWithExtraArgs(flags, argCount);

    if (argInstr)
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        AssertMsg(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices
            // All non-spread calls need StartCall to have the same number of args
            || (argInstr->GetSrc1()->IsIntConstOpnd()
                    && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count
                    && count == argCount), "StartCall has wrong number of arguments...");
    }
    else
    {
        AssertMsg(false, "Expect StartCall on other opcodes...");
    }

    // Update Func if this is the highest amount of stack we've used so far
    // to push args.
#if DBG
    m_callsOnStack--;
#endif
    if (m_func->m_argSlotsForFunctionsCalled < m_argsOnStack)
        m_func->m_argSlotsForFunctionsCalled = m_argsOnStack;
#if DBG
    if (m_callsOnStack == 0)
        Assert(m_argsOnStack == argCount);
#endif
    m_argsOnStack -= argCount;

    if (m_func->IsJitInDebugMode())
    {
        // Insert bailout after return from a call, script or library function call.
        this->InsertBailOutForDebugger(
            m_jnReader.GetCurrentOffset(), // bailout will resume at the offset of next instr.
            c_debuggerBailOutKindForCall);
    }
}